

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareDump.cpp
# Opt level: O0

void CompareOnTheFlyAnimation(comparer_context *comp)

{
  scoped_chunk sVar1;
  bool bVar2;
  Chunk *pCVar3;
  undefined1 local_4f8 [8];
  sliced_chunk_iterator it;
  sliced_chunk_reader reader;
  string local_4c0;
  allocator local_499;
  string local_498;
  allocator local_471;
  string local_470;
  aiString local_450;
  allocator local_39;
  string local_38;
  scoped_chunk local_18;
  scoped_chunk chunk;
  comparer_context *comp_local;
  
  chunk.ctx = comp;
  scoped_chunk::scoped_chunk(&local_18,comp,"aiAnimation");
  sVar1.ctx = chunk.ctx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"mName",&local_39);
  comparer_context::cmp<aiString>(&local_450,sVar1.ctx,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  sVar1 = chunk;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_470,"mDuration",&local_471);
  comparer_context::cmp<double>(sVar1.ctx,&local_470);
  std::__cxx11::string::~string((string *)&local_470);
  std::allocator<char>::~allocator((allocator<char> *)&local_471);
  sVar1 = chunk;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_498,"mTicksPerSecond",&local_499);
  comparer_context::cmp<double>(sVar1.ctx,&local_498);
  std::__cxx11::string::~string((string *)&local_498);
  std::allocator<char>::~allocator((allocator<char> *)&local_499);
  sVar1 = chunk;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_4c0,"mNumChannels",(allocator *)((long)&reader.ctx + 7));
  comparer_context::cmp<unsigned_int>(sVar1.ctx,&local_4c0);
  std::__cxx11::string::~string((string *)&local_4c0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&reader.ctx + 7));
  sliced_chunk_reader::sliced_chunk_reader((sliced_chunk_reader *)&it.end,chunk.ctx);
  sliced_chunk_reader::begin((sliced_chunk_iterator *)local_4f8,(sliced_chunk_reader *)&it.end);
  while( true ) {
    bVar2 = sliced_chunk_iterator::is_end((sliced_chunk_iterator *)local_4f8);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    pCVar3 = sliced_chunk_iterator::operator*((sliced_chunk_iterator *)local_4f8);
    if (pCVar3->first == 0x1238) {
      CompareOnTheFlyNodeAnim(chunk.ctx);
    }
    sliced_chunk_iterator::operator++((sliced_chunk_iterator *)local_4f8);
  }
  sliced_chunk_iterator::~sliced_chunk_iterator((sliced_chunk_iterator *)local_4f8);
  sliced_chunk_reader::~sliced_chunk_reader((sliced_chunk_reader *)&it.end);
  scoped_chunk::~scoped_chunk(&local_18);
  return;
}

Assistant:

void CompareOnTheFlyAnimation(comparer_context& comp)   {
    scoped_chunk chunk(comp,"aiAnimation");

    comp.cmp<aiString>("mName");
    comp.cmp<double>("mDuration");
    comp.cmp<double>("mTicksPerSecond");
    comp.cmp<uint32_t>("mNumChannels");

    sliced_chunk_reader reader(comp);
    for(sliced_chunk_iterator it = reader.begin(); !it.is_end(); ++it) {
        if ((*it).first == ASSBIN_CHUNK_AINODEANIM) {
            CompareOnTheFlyNodeAnim(comp);
        }
    }
}